

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

void NULLCMemory::read_into_bool_array(NULLCArray buffer,int offset,NULLCArray result)

{
  char *error;
  uint uVar1;
  
  uVar1 = result.len;
  if ((result.ptr == (char *)0x0) || (buffer.ptr == (char *)0x0)) {
    error = "buffer is empty";
  }
  else if (offset < 0) {
    error = "offset is negative";
  }
  else if ((int)uVar1 < 0) {
    error = "element count is negative";
  }
  else {
    if (uVar1 <= buffer.len - offset && (uint)offset < buffer.len) {
      memcpy(result.ptr,buffer.ptr + (uint)offset,(ulong)uVar1);
      return;
    }
    error = "buffer overflow";
  }
  nullcThrowError(error);
  return;
}

Assistant:

void read_into_bool_array(NULLCArray buffer, int offset, NULLCArray result)
	{
		if(!result.ptr)
		{
			nullcThrowError("buffer is empty");
			return;
		}

		if(!check_access(buffer, offset, 0, result.len))
			return;

		memcpy(result.ptr, buffer.ptr + offset, sizeof(bool) * result.len);
	}